

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

void uv__make_close_pending(uv_handle_t *handle)

{
  long in_RDI;
  
  if ((*(uint *)(in_RDI + 0x30) & 1) == 0) {
    __assert_fail("handle->flags & UV_CLOSING","src/unix/core.c",0x9a,
                  "void uv__make_close_pending(uv_handle_t *)");
  }
  if ((*(uint *)(in_RDI + 0x30) & 2) == 0) {
    *(undefined8 *)(in_RDI + 0x38) = *(undefined8 *)(*(long *)(in_RDI + 0x10) + 0x110);
    *(long *)(*(long *)(in_RDI + 0x10) + 0x110) = in_RDI;
    return;
  }
  __assert_fail("!(handle->flags & UV_CLOSED)","src/unix/core.c",0x9b,
                "void uv__make_close_pending(uv_handle_t *)");
}

Assistant:

void uv__make_close_pending(uv_handle_t* handle) {
  assert(handle->flags & UV_CLOSING);
  assert(!(handle->flags & UV_CLOSED));
  handle->next_closing = handle->loop->closing_handles;
  handle->loop->closing_handles = handle;
}